

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x7ff);
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: GetArena() == NULL: ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,
                        "AddCleared() can only be used on a RepeatedPtrField not on an arena.");
    LogFinisher::operator=(&local_29,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size == this->total_size_)) {
    if (this->current_size_ <= this->total_size_) {
      InternalExtend(this,(this->total_size_ - this->current_size_) + 1);
    }
  }
  pRVar2 = this->rep_;
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + 1;
  pRVar2->elements[iVar1] = value;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == NULL)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetArena(value) == NULL)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}